

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_object_assign(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int64_t iVar1;
  JSValue excluded;
  int iVar2;
  long lVar3;
  JSValue target;
  JSValue JVar4;
  uint uStack_3c;
  
  target = JS_ToObject(ctx,*argv);
  if ((uint)target.tag == 6) {
    JVar4 = (JSValue)(ZEXT816(3) << 0x40);
LAB_001636d3:
    if ((0xfffffff4 < (uint)target.tag) &&
       (iVar2 = *target.u.ptr, *(int *)target.u.ptr = iVar2 + -1, iVar2 < 2)) {
      __JS_FreeValueRT(ctx->rt,target);
    }
    if ((0xfffffff4 < (uint)JVar4.tag) &&
       (iVar2 = *JVar4.u.ptr, *(int *)JVar4.u.ptr = iVar2 + -1, iVar2 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar4);
    }
    target = (JSValue)(ZEXT816(6) << 0x40);
  }
  else if (1 < argc) {
    lVar3 = 0;
    do {
      iVar1 = *(int64_t *)((long)&argv[1].tag + lVar3);
      if (((uint)iVar1 & 0xfffffffe) != 2) {
        JVar4.tag = iVar1;
        JVar4.u.ptr = ((JSValueUnion *)((long)&argv[1].u + lVar3))->ptr;
        JVar4 = JS_ToObject(ctx,JVar4);
        if (((uint)JVar4.tag == 6) ||
           (excluded.tag = 3, excluded.u.ptr = (void *)((ulong)uStack_3c << 0x20),
           iVar2 = JS_CopyDataProperties(ctx,target,JVar4,excluded,1), iVar2 != 0))
        goto LAB_001636d3;
        if ((0xfffffff4 < (uint)JVar4.tag) &&
           (iVar2 = *JVar4.u.ptr, *(int *)JVar4.u.ptr = iVar2 + -1, iVar2 < 2)) {
          __JS_FreeValueRT(ctx->rt,JVar4);
        }
      }
      lVar3 = lVar3 + 0x10;
    } while ((ulong)(uint)argc * 0x10 + -0x10 != lVar3);
  }
  return target;
}

Assistant:

static JSValue js_object_assign(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    // Object.assign(obj, source1)
    JSValue obj, s;
    int i;

    s = JS_UNDEFINED;
    obj = JS_ToObject(ctx, argv[0]);
    if (JS_IsException(obj))
        goto exception;
    for (i = 1; i < argc; i++) {
        if (!JS_IsNull(argv[i]) && !JS_IsUndefined(argv[i])) {
            s = JS_ToObject(ctx, argv[i]);
            if (JS_IsException(s))
                goto exception;
            if (JS_CopyDataProperties(ctx, obj, s, JS_UNDEFINED, TRUE))
                goto exception;
            JS_FreeValue(ctx, s);
        }
    }
    return obj;
exception:
    JS_FreeValue(ctx, obj);
    JS_FreeValue(ctx, s);
    return JS_EXCEPTION;
}